

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool __thiscall
ImTriangulator::IsEar(ImTriangulator *this,int i0,int i1,int i2,ImVec2 *v0,ImVec2 *v1,ImVec2 *v2)

{
  int iVar1;
  bool bVar2;
  ImTriangulatorNode **ppIVar3;
  ImTriangulatorNode **p;
  ImTriangulatorNode **ppIVar4;
  
  ppIVar4 = (this->_Reflexes).Data;
  ppIVar3 = ppIVar4 + (this->_Reflexes).Size;
  for (; ppIVar4 < ppIVar3; ppIVar4 = ppIVar4 + 1) {
    iVar1 = (*ppIVar4)->Index;
    if (((iVar1 != i2) && (iVar1 != i0)) && (iVar1 != i1)) {
      bVar2 = ImTriangleContainsPoint(v0,v1,v2,&(*ppIVar4)->Pos);
      if (bVar2) break;
    }
  }
  return ppIVar3 <= ppIVar4;
}

Assistant:

bool ImTriangulator::IsEar(int i0, int i1, int i2, const ImVec2& v0, const ImVec2& v1, const ImVec2& v2) const
{
    ImTriangulatorNode** p_end = _Reflexes.Data + _Reflexes.Size;
    for (ImTriangulatorNode** p = _Reflexes.Data; p < p_end; p++)
    {
        ImTriangulatorNode* reflex = *p;
        if (reflex->Index != i0 && reflex->Index != i1 && reflex->Index != i2)
            if (ImTriangleContainsPoint(v0, v1, v2, reflex->Pos))
                return false;
    }
    return true;
}